

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O3

size_t duckdb::Utf8Proc::RenderWidth(string *str)

{
  int32_t uc;
  undefined8 in_RAX;
  utf8proc_property_t *puVar1;
  size_t sVar2;
  ulong uVar3;
  int sz;
  undefined8 uStack_28;
  
  if (str->_M_string_length == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    uVar3 = 0;
    uStack_28 = in_RAX;
    do {
      uc = UTF8ToCodepoint((str->_M_dataplus)._M_p + uVar3,(int *)((long)&uStack_28 + 4));
      puVar1 = utf8proc_get_property(uc);
      sVar2 = sVar2 + (*(ushort *)&puVar1->field_0x14 >> 4 & 3);
      uVar3 = uVar3 + (long)uStack_28._4_4_;
    } while (uVar3 < str->_M_string_length);
  }
  return sVar2;
}

Assistant:

size_t Utf8Proc::RenderWidth(const std::string &str) {
	size_t render_width = 0;
	size_t pos = 0;
	while (pos < str.size()) {
		int sz;
		auto codepoint = Utf8Proc::UTF8ToCodepoint(str.c_str() + pos, sz);
		auto properties = duckdb::utf8proc_get_property(codepoint);
		render_width += properties->charwidth;
		pos += sz;
	}
	return render_width;
}